

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void c4::detail::base64_test_tables(void)

{
  code *pcVar1;
  bool bVar2;
  size_t i;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x40) {
      lVar3 = 0;
      while( true ) {
        if (lVar3 == 0x80) {
          return;
        }
        if (((long)(char)(&base64_char_to_sextet_)[lVar3] != -1) &&
           (lVar3 != (char)(&base64_sextet_to_char_)[(char)(&base64_char_to_sextet_)[lVar3]]))
        break;
        lVar3 = lVar3 + 1;
      }
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x45a2,"(size_t)s2c == i");
    }
    if (lVar3 != (char)(&base64_char_to_sextet_)[(char)(&base64_sextet_to_char_)[lVar3]]) break;
    lVar3 = lVar3 + 1;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  handle_error(0x1e7ac6,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x459a,"(size_t)c2s == i");
}

Assistant:

void base64_test_tables()
{
    for(size_t i = 0; i < C4_COUNTOF(detail::base64_sextet_to_char_); ++i)
    {
        char s2c = base64_sextet_to_char_[i];
        char c2s = base64_char_to_sextet_[(int)s2c];
        C4_CHECK((size_t)c2s == i);
    }
    for(size_t i = 0; i < C4_COUNTOF(detail::base64_char_to_sextet_); ++i)
    {
        char c2s = base64_char_to_sextet_[i];
        if(c2s == char(-1))
            continue;
        char s2c = base64_sextet_to_char_[(int)c2s];
        C4_CHECK((size_t)s2c == i);
    }
}